

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::broadcastToFederates(CommonCore *this,ActionMessage *cmd)

{
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_78;
  iterator local_60;
  iterator local_48;
  
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
            (&local_48,&(this->loopFederates).dataStorage);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_60,&(this->loopFederates).dataStorage);
  local_78.vec = local_48.vec;
  local_78.ptr = local_48.ptr;
  local_78.offset = local_48.offset;
  local_78._20_4_ = local_48._20_4_;
  while ((local_78.offset != local_60.offset || (local_78.vec != local_60.vec))) {
    if (((local_78.ptr)->fed != (FederateState *)0x0) && ((local_78.ptr)->state == OPERATING)) {
      (cmd->dest_id).gid = ((local_78.ptr)->fed->global_id)._M_i.gid;
      FederateState::addAction((local_78.ptr)->fed,cmd);
    }
    gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++(&local_78);
  }
  return;
}

Assistant:

void CommonCore::broadcastToFederates(ActionMessage& cmd)
{
    loopFederates.apply([&cmd](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            cmd.dest_id = fed->global_id;
            fed->addAction(cmd);
        }
    });
}